

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

void __thiscall
Internal_FontDelta::Internal_FontDelta
          (Internal_FontDelta *this,ON_Font *target_font,ON_wString *target_clean_logfont_name,
          ON_wString *target_clean_family_name,ON_Font *candidate_font)

{
  wchar_t wVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  wchar_t wVar6;
  int iVar7;
  int iVar8;
  wchar_t *pwVar9;
  wchar_t *pwVar10;
  ON_SHA1_Hash *a;
  ON_SHA1_Hash *b;
  byte bVar11;
  long lVar13;
  ON_wString installed_font_logfont_name;
  undefined1 local_60 [8];
  ON_wString candidate_clean_family_name;
  ON_wString target_postscript_name;
  ulong uVar12;
  
  this->m_candidate_font = candidate_font;
  this->m_hash_delta = 0;
  this->m_family_name_delta = 0;
  this->m_logfont_name_delta = 0;
  this->m_weight_delta = 0;
  this->m_weight_delta = 0;
  this->m_stretch_delta = 0;
  this->m_style_delta = 0;
  this->m_underline_and_strikethrough_delta = 0;
  if (candidate_font == (ON_Font *)0x0) {
    this->m_hash_delta = 6;
    return;
  }
  ON_Font::PostScriptName((ON_Font *)&target_postscript_name);
  bVar2 = ON_wString::IsNotEmpty(&target_postscript_name);
  if (bVar2) {
    pwVar9 = ON_wString::operator_cast_to_wchar_t_(&target_postscript_name);
    ON_Font::PostScriptName((ON_Font *)&installed_font_logfont_name);
    pwVar10 = ON_wString::operator_cast_to_wchar_t_(&installed_font_logfont_name);
    bVar2 = ON_wString::EqualOrdinal(pwVar9,pwVar10,true);
    ON_wString::~ON_wString(&installed_font_logfont_name);
    if (bVar2) {
      this->m_weight_delta = 0;
      this->m_stretch_delta = 0;
      uVar5 = 0;
      bVar2 = true;
      goto LAB_004a875a;
    }
  }
  if ((((target_font->m_font_origin != WindowsFont) ||
       (candidate_font->m_font_origin != WindowsFont)) ||
      (bVar2 = ON_wString::IsNotEmpty(target_clean_logfont_name), !bVar2)) ||
     (bVar2 = ON_wString::IsEmpty(target_clean_logfont_name), bVar2)) {
    bVar2 = false;
  }
  else {
    ON_Font::WindowsLogfontName((ON_Font *)local_60,(NameLocale)candidate_font);
    pwVar9 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_60);
    Internal_NameOverlapCleanName((wchar_t *)&installed_font_logfont_name,SUB81(pwVar9,0));
    ON_wString::~ON_wString((ON_wString *)local_60);
    pwVar9 = ON_wString::operator_cast_to_wchar_t_(target_clean_logfont_name);
    pwVar10 = ON_wString::operator_cast_to_wchar_t_(&installed_font_logfont_name);
    bVar2 = ON_wString::EqualOrdinal(pwVar9,pwVar10,true);
    ON_wString::~ON_wString(&installed_font_logfont_name);
  }
  uVar4 = (uint)target_font->m_font_weight - (uint)candidate_font->m_font_weight;
  uVar5 = -uVar4;
  if (0 < (int)uVar4) {
    uVar5 = uVar4;
  }
  this->m_weight_delta = uVar5 & 0xff;
  uVar4 = (uint)target_font->m_font_stretch - (uint)candidate_font->m_font_stretch;
  uVar5 = -uVar4;
  if (0 < (int)uVar4) {
    uVar5 = uVar4;
  }
  this->m_stretch_delta = uVar5 & 0xff;
  uVar4 = (uint)target_font->m_font_style - (uint)candidate_font->m_font_style;
  uVar5 = -uVar4;
  if (0 < (int)uVar4) {
    uVar5 = uVar4;
  }
  uVar5 = uVar5 & 0xff;
LAB_004a875a:
  this->m_style_delta = uVar5;
  ON_wString::ON_wString(&candidate_clean_family_name);
  bVar3 = true;
  if (bVar2 == false) {
    ON_Font::FamilyName((ON_Font *)local_60);
    pwVar9 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_60);
    Internal_NameOverlapCleanName((wchar_t *)&installed_font_logfont_name,SUB81(pwVar9,0));
    ON_wString::operator=(&candidate_clean_family_name,&installed_font_logfont_name);
    ON_wString::~ON_wString(&installed_font_logfont_name);
    ON_wString::~ON_wString((ON_wString *)local_60);
    pwVar9 = ON_wString::operator_cast_to_wchar_t_(target_clean_family_name);
    pwVar10 = ON_wString::operator_cast_to_wchar_t_(&candidate_clean_family_name);
    bVar3 = ON_wString::EqualOrdinal(pwVar9,pwVar10,true);
  }
  if (target_font->m_font_bUnderlined != candidate_font->m_font_bUnderlined) {
    this->m_underline_and_strikethrough_delta = this->m_underline_and_strikethrough_delta + 1;
  }
  if (target_font->m_font_bStrikethrough != candidate_font->m_font_bStrikethrough) {
    this->m_underline_and_strikethrough_delta = this->m_underline_and_strikethrough_delta + 1;
  }
  this->m_family_name_delta = 0;
  bVar11 = this->m_weight_delta == 0 & bVar3;
  uVar12 = (ulong)bVar11;
  if (((this->m_style_delta == 0 && this->m_stretch_delta == 0) & bVar11) == 1) {
    if (this->m_underline_and_strikethrough_delta == 0) {
      a = ON_Font::FontCharacteristicsHash(target_font);
      b = ON_Font::FontCharacteristicsHash(candidate_font);
      bVar2 = ::operator==(a,b);
    }
    else {
      bVar2 = false;
    }
    uVar5 = (uint)(bVar2 ^ 1);
  }
  else {
    bVar11 = this->m_style_delta < 2 & bVar2 & this->m_stretch_delta == 0;
    if (bVar3 == false && bVar11 == 0) {
      pwVar9 = ON_wString::operator_cast_to_wchar_t_(&candidate_clean_family_name);
      if (pwVar9 == (wchar_t *)0x0) {
        lVar13 = 0;
      }
      else {
        pwVar10 = ON_wString::operator_cast_to_wchar_t_(target_clean_family_name);
        lVar13 = 0;
        while( true ) {
          pwVar9 = Internal_NameOverLapSkipNoise(pwVar9,SUB81(uVar12,0));
          wVar1 = pwVar10[lVar13];
          if (wVar1 == L'\0') break;
          uVar12 = (ulong)(uint)*pwVar9;
          wVar6 = ON_wString::MapCharacterOrdinal(LowerOrdinal,*pwVar9);
          if (wVar1 != wVar6) break;
          pwVar9 = pwVar9 + 1;
          lVar13 = lVar13 + 1;
        }
      }
      iVar7 = ON_wString::Length(target_clean_family_name);
      iVar7 = iVar7 - (int)lVar13;
      this->m_family_name_delta = iVar7;
      if (iVar7 == 0) {
        iVar7 = ON_wString::Length(target_clean_family_name);
        iVar8 = ON_wString::Length(&candidate_clean_family_name);
        this->m_family_name_delta = iVar7 - iVar8;
      }
      uVar5 = 4;
      if (this->m_style_delta != 0) {
        uVar5 = target_font->m_font_style == Upright | 4;
      }
    }
    else {
      uVar5 = bVar11 ^ 3;
    }
  }
  this->m_hash_delta = uVar5;
  ON_wString::~ON_wString(&candidate_clean_family_name);
  ON_wString::~ON_wString(&target_postscript_name);
  return;
}

Assistant:

Internal_FontDelta(
    const ON_Font& target_font,
    const ON_wString& target_clean_logfont_name,
    const ON_wString& target_clean_family_name,
    const ON_Font* candidate_font
  )
    : m_candidate_font(candidate_font)
  {
    if (nullptr == m_candidate_font)
    {
      m_hash_delta = 6;
      return;
    }

    // When we have identical PostScript names, we assume they
    // are correct and assume font family, weight, stretch, and style 
    // are exact matches.
    const ON_wString target_postscript_name = target_font.PostScriptName();
    const bool bEqualPostScriptName
      = target_postscript_name.IsNotEmpty()
      && ON_wString::EqualOrdinal(target_postscript_name, m_candidate_font->PostScriptName(), true);

    const bool bEqualLogfontName
      = bEqualPostScriptName
      || (
         ON_Font::Origin::WindowsFont == target_font.FontOrigin()
         && ON_Font::Origin::WindowsFont == candidate_font->FontOrigin()
         && target_clean_logfont_name.IsNotEmpty()
         && Internal_EqualLogfontName(target_clean_logfont_name, candidate_font)
         );

    m_weight_delta 
      = bEqualPostScriptName
      ? 0
      : abs(((int)static_cast<unsigned int>(target_font.FontWeight())) - ((int)static_cast<unsigned int>(candidate_font->FontWeight())));
    m_stretch_delta 
      = bEqualPostScriptName
      ? 0
      : abs(((int)static_cast<unsigned int>(target_font.FontStretch())) - ((int)static_cast<unsigned int>(candidate_font->FontStretch())));
    m_style_delta 
      = bEqualPostScriptName
      ? 0
      : abs(((int)static_cast<unsigned int>(target_font.FontStyle())) - ((int)static_cast<unsigned int>(candidate_font->FontStyle())));

    ON_wString candidate_clean_family_name;
    const bool bEqualFamilyName 
      = bEqualLogfontName 
      || Internal_EqualFamilyName(target_clean_family_name, candidate_font, candidate_clean_family_name);      

    if (target_font.IsUnderlined() != candidate_font->IsUnderlined())
      m_underline_and_strikethrough_delta++;
    if (target_font.IsStrikethrough() != candidate_font->IsStrikethrough())
      m_underline_and_strikethrough_delta++;

    m_family_name_delta = 0;


    if (
      bEqualFamilyName
      && 0 == m_weight_delta
      && 0 == m_stretch_delta
      && 0 == m_style_delta
      )
    {
      // This is either an exact match (m_hash_delta = 0) or a very close match (m_hash_delta = 1).
      m_hash_delta 
        = (0 == m_underline_and_strikethrough_delta && target_font.FontCharacteristicsHash() == candidate_font->FontCharacteristicsHash()) 
        ? 0
        : 1;
      return;
    }

    // If PANOSE information were available for target_font and candidate_font, it would be useful here.

    if (
      bEqualLogfontName 
      && 0 == m_stretch_delta 
      && m_style_delta <= 1
      )
    {
      // There are at most 4 "faces" with the same WINDOWS LOGFONT.lfFaceName and the differences
      // among the four "faces" are almost always in weight (normal or bold) or style (upright or italic). 
      // Fonts with larger differences in weight or style or any significant difference in stretch 
      // typically have different values of LOGFONT.lfFaceName.
      // (Underlined and Strikethrough are not "faces").
      m_hash_delta = 2;
      return;
    }

    if (bEqualFamilyName)
    {
      // A family, like "Arial", can have manu faces with a wide variety of weights, stretches, and styles.
      // The LOGFONTs with lfFaceName = "Arial", "Arial Narrow", "Arial Black", ... are all in the "Arial" family.
      m_hash_delta = 3;
      return;
    }

    // Differences below here (m_hash_delta >= 4) are generally visually significant.
    // Calculate font family name overlap
    int name_overlap = Internal_NameOverLap(target_clean_family_name, candidate_clean_family_name, true);
    m_family_name_delta = target_clean_family_name.Length() - name_overlap;
    if (0 == m_family_name_delta)
    {
      // clean_font_family_name.Length() = name_overlap means that
      // clean_font_family_name.Length() <= installed_font_family_name.Length()
      // and installed_font_family_name begins with clean_font_family_name.
      // If installed_font_family_name.Length() > clean_font_family_name.Length(),
      // m_name_delta < 0 and it measures how much tail was not matched
      m_family_name_delta = target_clean_family_name.Length() - candidate_clean_family_name.Length();
    }

    m_hash_delta 
      = (0 == m_style_delta || ON_Font::Style::Upright != target_font.FontStyle())
      ? 4
      : 5;
  }